

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O3

UInt32 crnlib::Backward(CLzmaEnc *p,UInt32 *backRes,UInt32 cur)

{
  UInt32 UVar1;
  UInt32 UVar2;
  UInt32 UVar3;
  ulong uVar4;
  uint uVar5;
  UInt32 UVar6;
  
  UVar6 = p->opt[cur].posPrev;
  UVar2 = p->opt[cur].backPrev;
  p->optimumEndIndex = cur;
  do {
    uVar5 = UVar6;
    uVar4 = (ulong)uVar5;
    if (p->opt[cur].prev1IsChar == 0) {
      UVar6 = p->opt[uVar4].posPrev;
      UVar3 = p->opt[uVar4].backPrev;
    }
    else {
      p->opt[uVar4].backPrev = 0xffffffff;
      p->opt[uVar4].prev1IsChar = 0;
      UVar6 = uVar5 - 1;
      p->opt[uVar4].posPrev = UVar6;
      UVar3 = 0xffffffff;
      if (p->opt[cur].prev2 != 0) {
        p->opt[UVar6].prev1IsChar = 0;
        UVar1 = p->opt[cur].backPrev2;
        p->opt[UVar6].posPrev = p->opt[cur].posPrev2;
        p->opt[UVar6].backPrev = UVar1;
      }
    }
    p->opt[uVar4].backPrev = UVar2;
    p->opt[uVar4].posPrev = cur;
    UVar2 = UVar3;
    cur = uVar5;
  } while (uVar4 != 0);
  *backRes = p->opt[0].backPrev;
  UVar6 = p->opt[0].posPrev;
  p->optimumCurrentIndex = UVar6;
  return UVar6;
}

Assistant:

static UInt32 Backward(CLzmaEnc* p, UInt32* backRes, UInt32 cur) {
  UInt32 posMem = p->opt[cur].posPrev;
  UInt32 backMem = p->opt[cur].backPrev;
  p->optimumEndIndex = cur;
  do {
    if (p->opt[cur].prev1IsChar) {
      MakeAsChar(&p->opt[posMem])
          p->opt[posMem]
              .posPrev = posMem - 1;
      if (p->opt[cur].prev2) {
        p->opt[posMem - 1].prev1IsChar = False;
        p->opt[posMem - 1].posPrev = p->opt[cur].posPrev2;
        p->opt[posMem - 1].backPrev = p->opt[cur].backPrev2;
      }
    }
    {
      UInt32 posPrev = posMem;
      UInt32 backCur = backMem;

      backMem = p->opt[posPrev].backPrev;
      posMem = p->opt[posPrev].posPrev;

      p->opt[posPrev].backPrev = backCur;
      p->opt[posPrev].posPrev = cur;
      cur = posPrev;
    }
  } while (cur != 0);
  *backRes = p->opt[0].backPrev;
  p->optimumCurrentIndex = p->opt[0].posPrev;
  return p->optimumCurrentIndex;
}